

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

ssize_t __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write
          (arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
           *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  type __dest;
  void *pvVar1;
  char *__src;
  basic_string_view<char> s;
  
  __src = "false";
  if (__fd != 0) {
    __src = "true";
  }
  s.size_ = (ulong)(uint)__fd ^ 5;
  if (this->specs_ != (format_specs *)0x0) {
    s.data_ = __src;
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write<char>
              (&this->writer_,s,this->specs_);
    return extraout_RAX;
  }
  __dest = reserve<fmt::v5::internal::basic_buffer<char>>
                     ((back_insert_iterator<fmt::v5::internal::basic_buffer<char>_> *)this,s.size_);
  if (s.size_ != 0) {
    pvVar1 = memmove(__dest,__src,s.size_);
    return (ssize_t)pvVar1;
  }
  return (ssize_t)__dest;
}

Assistant:

void write(bool value) {
    string_view sv(value ? "true" : "false");
    specs_ ? writer_.write(sv, *specs_) : writer_.write(sv);
  }